

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointObservationHistory.h
# Opt level: O2

void __thiscall JointObservationHistory::Print(JointObservationHistory *this)

{
  string sStack_28;
  
  SoftPrint_abi_cxx11_(&sStack_28,this);
  std::operator<<((ostream *)&std::cout,(string *)&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void Print() const {std::cout << SoftPrint(); }